

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_zeroblob(sqlite3_stmt *pStmt,int i,int n)

{
  int iVar1;
  Mem *in_RDI;
  Vdbe *p;
  int rc;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = vdbeUnbind((Vdbe *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (int)((ulong)in_RDI >> 0x20));
  if (iVar1 == 0) {
    sqlite3VdbeMemSetZeroBlob(in_RDI,in_stack_ffffffffffffffdc);
    sqlite3_mutex_leave((sqlite3_mutex *)0x116fb7);
  }
  return iVar1;
}

Assistant:

SQLITE_STDCALL sqlite3_bind_zeroblob(sqlite3_stmt *pStmt, int i, int n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetZeroBlob(&p->aVar[i-1], n);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}